

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O2

bool __thiscall duckdb::RowGroup::CheckZonemap(RowGroup *this,ScanFilterInfo *filters)

{
  TableFilter *filter;
  idx_t beg_row;
  FilterPropagateResult FVar1;
  ulong uVar2;
  const_reference pvVar3;
  ColumnData *this_00;
  idx_t i;
  ulong __n;
  
  ScanFilterInfo::CheckAllFilters(filters);
  __n = 0;
  while( true ) {
    uVar2 = ((long)(filters->filter_list).
                   super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                   super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)(filters->filter_list).
                  super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                  super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                  _M_impl.super__Vector_impl_data._M_start) / 0x28;
    if (uVar2 <= __n) break;
    pvVar3 = vector<duckdb::ScanFilter,_true>::get<true>(&filters->filter_list,__n);
    filter = pvVar3->filter;
    if (pvVar3->table_column_index == 0xffffffffffffffff) {
      beg_row = (this->super_SegmentBase<duckdb::RowGroup>).start;
      FVar1 = CheckRowIdFilter(filter,beg_row,
                               (this->super_SegmentBase<duckdb::RowGroup>).count.
                               super___atomic_base<unsigned_long>._M_i + beg_row);
    }
    else {
      this_00 = GetColumn(this,pvVar3->table_column_index);
      FVar1 = ColumnData::CheckZonemap(this_00,filter);
    }
    if (FVar1 == FILTER_ALWAYS_FALSE) break;
    if ((filter->filter_type == OPTIONAL_FILTER) || (FVar1 == FILTER_ALWAYS_TRUE)) {
      ScanFilterInfo::SetFilterAlwaysTrue(filters,__n);
    }
    __n = __n + 1;
  }
  return uVar2 <= __n;
}

Assistant:

bool RowGroup::CheckZonemap(ScanFilterInfo &filters) {
	auto &filter_list = filters.GetFilterList();
	// new row group - label all filters as up for grabs again
	filters.CheckAllFilters();
	for (idx_t i = 0; i < filter_list.size(); i++) {
		auto &entry = filter_list[i];
		auto &filter = entry.filter;
		auto base_column_index = entry.table_column_index;

		FilterPropagateResult prune_result;

		if (base_column_index == COLUMN_IDENTIFIER_ROW_ID) {
			prune_result = CheckRowIdFilter(filter, this->start, this->start + this->count);
		} else {
			prune_result = GetColumn(base_column_index).CheckZonemap(filter);
		}

		if (prune_result == FilterPropagateResult::FILTER_ALWAYS_FALSE) {
			return false;
		}
		if (filter.filter_type == TableFilterType::OPTIONAL_FILTER) {
			// these are only for row group checking, set as always true so we don't check it
			filters.SetFilterAlwaysTrue(i);
		} else if (prune_result == FilterPropagateResult::FILTER_ALWAYS_TRUE) {
			// filter is always true - no need to check it
			// label the filter as always true so we don't need to check it anymore
			filters.SetFilterAlwaysTrue(i);
		}
	}
	return true;
}